

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_turtle.cc
# Opt level: O0

void __thiscall PainterTest_CanDrawSomething_Test::TestBody(PainterTest_CanDrawSomething_Test *this)

{
  bool bVar1;
  MockSpec<void_()> *this_00;
  TypedExpectation<void_()> *this_01;
  char *message;
  MockTurtle *in_RSI;
  char *in_R9;
  string local_290;
  AssertHelper local_270;
  Message local_268;
  bool local_259;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_;
  Painter painter;
  WithoutMatchers local_22d [13];
  MockSpec<void_()> local_220;
  undefined1 local_210 [8];
  MockTurtle turtle;
  PainterTest_CanDrawSomething_Test *this_local;
  
  turtle.gmock10_GetY_17.super_UntypedFunctionMockerBase.untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  MockTurtle::MockTurtle((MockTurtle *)local_210);
  local_220.function_mocker_ =
       (FunctionMocker<void_()> *)MockTurtle::gmock_PenDown((MockSpec<void_()> *)local_210,in_RSI);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<void_()>::operator()(&local_220,local_22d,(void *)0x0);
  this_01 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Ed-Yang[P]gturtle/tests/test_turtle.cc"
                       ,0xb,"turtle","PenDown()");
  testing::AtLeast((testing *)&painter,1);
  testing::internal::TypedExpectation<void_()>::Times(this_01,(Cardinality *)&painter);
  testing::Cardinality::~Cardinality((Cardinality *)&painter);
  Painter::Painter((Painter *)&gtest_ar_.message_,(Turtle *)local_210);
  local_259 = Painter::DrawCircle((Painter *)&gtest_ar_.message_,0,0,10);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_258,&local_259,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_290,(internal *)local_258,(AssertionResult *)"painter.DrawCircle(0, 0, 10)",
               "false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Ed-Yang[P]gturtle/tests/test_turtle.cc"
               ,0x10,message);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  MockTurtle::~MockTurtle((MockTurtle *)local_210);
  return;
}

Assistant:

TEST(PainterTest, CanDrawSomething)
{
    MockTurtle turtle;             // #2

    EXPECT_CALL(turtle, PenDown()) // #3
        .Times(AtLeast(1));

    Painter painter(&turtle); // #4

    EXPECT_TRUE(painter.DrawCircle(0, 0, 10));
}